

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Int64ToDoubleMap::Int64ToDoubleMap
          (Int64ToDoubleMap *this,Int64ToDoubleMap *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->map_).map_.elements_.num_elements_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Int64ToDoubleMap_004afd08;
  (this->map_).map_.elements_.num_buckets_ = 1;
  (this->map_).map_.elements_.seed_ = 0;
  (this->map_).map_.elements_.index_of_first_non_null_ = 1;
  (this->map_).map_.elements_.table_ = (void **)&google::protobuf::internal::kGlobalEmptyTable;
  (this->map_).map_.elements_.alloc_.arena_ = (Arena *)0x0;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  google::protobuf::internal::
  MapFieldLite<CoreML::Specification::Int64ToDoubleMap_MapEntry_DoNotUse,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1>
  ::MergeFrom(&this->map_,&from->map_);
  return;
}

Assistant:

Int64ToDoubleMap::Int64ToDoubleMap(const Int64ToDoubleMap& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  map_.MergeFrom(from.map_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Int64ToDoubleMap)
}